

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_async_notification_event_uninit(ma_async_notification_event *pNotificationEvent)

{
  if (pNotificationEvent != (ma_async_notification_event *)0x0) {
    pthread_cond_destroy((pthread_cond_t *)&(pNotificationEvent->e).cond);
    pthread_mutex_destroy((pthread_mutex_t *)&(pNotificationEvent->e).lock);
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_async_notification_event_uninit(ma_async_notification_event* pNotificationEvent)
{
    if (pNotificationEvent == NULL) {
        return MA_INVALID_ARGS;
    }

    #ifndef MA_NO_THREADING
    {
        ma_event_uninit(&pNotificationEvent->e);
        return MA_SUCCESS;
    }
    #else
    {
        return MA_NOT_IMPLEMENTED;  /* Threading is disabled. */
    }
    #endif
}